

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O1

void __thiscall
branch_and_reduce_algorithm::compute_fold
          (branch_and_reduce_algorithm *this,vector<int,_std::allocator<int>_> *S,
          vector<int,_std::allocator<int>_> *NS)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pvVar4;
  pointer piVar5;
  int *piVar6;
  pointer piVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  _func_int **pp_Var9;
  pointer psVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar11;
  element_type *peVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  ulong uVar14;
  int *piVar15;
  int *piVar16;
  pointer piVar17;
  int iVar18;
  const_iterator __begin1;
  long lVar19;
  ulong uVar20;
  int *piVar21;
  ulong uVar22;
  int iVar23;
  vector<int,_std::allocator<int>_> *__range1_2;
  vector<int,_std::allocator<int>_> vs;
  vector<int,_std::allocator<int>_> removed;
  vector<int,_std::allocator<int>_> *__range1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  newAdj;
  vector<int,_std::allocator<int>_> copyOfTmp;
  undefined1 local_f9;
  vector<int,_std::allocator<int>_> local_f8;
  vector<int,_std::allocator<int>_> local_e0;
  element_type *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  vector<int,_std::allocator<int>_> *local_b8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_b0;
  undefined1 local_98 [16];
  pointer local_88;
  
  lVar19 = (long)(S->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_finish -
           (long)(S->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_start;
  if ((long)(NS->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(NS->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start >> 2 != (lVar19 >> 2) + 1) {
    __assert_fail("NS.size() == S.size() + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                  ,0xca,
                  "void branch_and_reduce_algorithm::compute_fold(const std::vector<int> &, const std::vector<int> &)"
                 );
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_e0,lVar19 >> 1,(allocator_type *)local_98);
  piVar16 = (S->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar21 = (S->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish;
  uVar14 = (long)piVar21 - (long)piVar16 >> 2;
  if ((long)piVar21 - (long)piVar16 != 0) {
    uVar20 = 0;
    do {
      local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar20] = piVar16[uVar20];
      uVar20 = uVar20 + 1;
    } while ((uVar20 & 0xffffffff) < uVar14);
  }
  if (piVar21 != piVar16) {
    piVar17 = (NS->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start;
    uVar20 = 0;
    do {
      uVar22 = uVar20 + 1 & 0xffffffff;
      *(int *)((long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar20 * 4 + ((long)piVar21 - (long)piVar16)
              ) = piVar17[uVar22];
      uVar20 = uVar20 + 1;
    } while (uVar22 < uVar14);
  }
  piVar15 = (NS->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  iVar1 = *piVar15;
  iVar23 = (this->used).uid;
  (this->used).uid = iVar23 + 1;
  if (iVar23 < -1) {
    piVar17 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar19 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar17;
    if (lVar19 != 0) {
      uVar14 = 0;
      do {
        piVar17[uVar14] = 0;
        uVar14 = uVar14 + 1;
      } while ((uVar14 & 0xffffffff) < (ulong)(lVar19 >> 2));
    }
    (this->used).uid = 1;
  }
  if (piVar16 != piVar21) {
    piVar17 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar17[*piVar16] = (this->used).uid;
      piVar16 = piVar16 + 1;
    } while (piVar16 != piVar21);
  }
  piVar16 = (NS->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish;
  local_b8 = S;
  if (piVar15 == piVar16) {
    iVar23 = 0;
  }
  else {
    piVar17 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pvVar4 = (this->adj).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar5 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    iVar23 = 0;
    do {
      iVar18 = *piVar15;
      if (piVar17[iVar18] == (this->used).uid) {
        __assert_fail("!used.get(v)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                      ,0xdc,
                      "void branch_and_reduce_algorithm::compute_fold(const std::vector<int> &, const std::vector<int> &)"
                     );
      }
      piVar21 = pvVar4[iVar18].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar6 = *(pointer *)
                ((long)&pvVar4[iVar18].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (piVar21 != piVar6) {
        piVar7 = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar18 = *piVar21;
          if ((piVar5[iVar18] < 0) &&
             (iVar2 = (this->used).uid, iVar3 = piVar17[iVar18], piVar17[iVar18] = iVar2,
             iVar3 != iVar2)) {
            lVar19 = (long)iVar23;
            iVar23 = iVar23 + 1;
            piVar7[lVar19] = iVar18;
          }
          piVar21 = piVar21 + 1;
        } while (piVar21 != piVar6);
      }
      piVar15 = piVar15 + 1;
    } while (piVar15 != piVar16);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_b0,(long)(iVar23 + 1),(allocator_type *)local_98);
  _Var8._M_current =
       (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  std::vector<int,std::allocator<int>>::
  vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)local_98,_Var8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (_Var8._M_current + iVar23),(allocator_type *)&local_f8);
  pp_Var9 = (_func_int **)
            ((local_b0.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start;
  piVar17 = ((local_b0.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
  ;
  piVar5 = ((local_b0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  ((local_b0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_98._0_8_;
  ((local_b0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_98._8_8_;
  ((local_b0.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_88;
  local_98._0_8_ = pp_Var9;
  local_98._8_8_ = piVar17;
  local_88 = piVar5;
  if (pp_Var9 != (_func_int **)0x0) {
    operator_delete(pp_Var9,(long)piVar5 - (long)pp_Var9);
  }
  piVar17 = ((local_b0.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start;
  piVar5 = ((local_b0.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish;
  if (piVar17 != piVar5) {
    uVar14 = (long)piVar5 - (long)piVar17 >> 2;
    lVar19 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar19 == 0; lVar19 = lVar19 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar17,piVar5,((uint)lVar19 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar17,piVar5);
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&local_f8,(long)(iVar23 + 1),(allocator_type *)local_98);
  *local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       iVar1;
  iVar23 = (this->used).uid;
  (this->used).uid = iVar23 + 1;
  if (iVar23 < -1) {
    piVar17 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar19 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar17;
    if (lVar19 != 0) {
      uVar14 = 0;
      do {
        piVar17[uVar14] = 0;
        uVar14 = uVar14 + 1;
      } while ((uVar14 & 0xffffffff) < (ulong)(lVar19 >> 2));
    }
    (this->used).uid = 1;
  }
  piVar16 = (local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  piVar21 = (local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (piVar16 != piVar21) {
    piVar17 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar17[*piVar16] = (this->used).uid;
      piVar16 = piVar16 + 1;
    } while (piVar16 != piVar21);
  }
  piVar16 = (NS->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar21 = (NS->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish;
  if (piVar16 != piVar21) {
    piVar17 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar17[*piVar16] = (this->used).uid;
      piVar16 = piVar16 + 1;
    } while (piVar16 != piVar21);
  }
  piVar17 = ((local_b0.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start;
  if (((local_b0.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
      _M_impl.super__Vector_impl_data._M_finish != piVar17) {
    uVar14 = 0;
    do {
      iVar23 = piVar17[uVar14];
      pvVar4 = (this->adj).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar16 = pvVar4[iVar23].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar21 = *(pointer *)
                 ((long)&pvVar4[iVar23].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data + 8);
      if (piVar16 == piVar21) {
        bVar11 = false;
        iVar18 = 0;
      }
      else {
        piVar17 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar5 = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar18 = 0;
        bVar11 = false;
        do {
          iVar2 = *piVar16;
          if ((piVar17[iVar2] < 0) && (piVar7[iVar2] != (this->used).uid)) {
            if ((!bVar11) && (iVar1 < iVar2)) {
              lVar19 = (long)iVar18;
              iVar18 = iVar18 + 1;
              piVar5[lVar19] = iVar1;
              bVar11 = true;
            }
            lVar19 = (long)iVar18;
            iVar18 = iVar18 + 1;
            piVar5[lVar19] = iVar2;
          }
          piVar16 = piVar16 + 1;
        } while (piVar16 != piVar21);
      }
      if (!bVar11) {
        lVar19 = (long)iVar18;
        iVar18 = iVar18 + 1;
        (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar19] = iVar1;
      }
      uVar14 = (ulong)((int)uVar14 + 1);
      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar14] = iVar23;
      _Var8._M_current =
           (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
      std::vector<int,std::allocator<int>>::
      vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                ((vector<int,std::allocator<int>> *)local_98,_Var8,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (_Var8._M_current + iVar18),(allocator_type *)&local_c8);
      pp_Var9 = (_func_int **)
                local_b0.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar14].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar17 = local_b0.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar14].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish;
      piVar5 = local_b0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar14].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
      local_b0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar14].
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_98._0_8_;
      local_b0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar14].
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)local_98._8_8_;
      local_b0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar14].
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = local_88;
      local_98._0_8_ = pp_Var9;
      local_98._8_8_ = piVar17;
      local_88 = piVar5;
      if (pp_Var9 != (_func_int **)0x0) {
        operator_delete(pp_Var9,(long)piVar5 - (long)pp_Var9);
      }
      piVar17 = ((local_b0.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start;
    } while (uVar14 < (ulong)((long)((local_b0.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish - (long)piVar17 >> 2));
  }
  fold::fold((fold *)local_98,
             (int)((ulong)((long)(local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start) >> 2),&local_e0,&local_f8,
             &local_b0,this);
  local_c8 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<fold,std::allocator<fold>,fold>
            (&_Stack_c0,(fold **)&local_c8,(allocator<fold> *)&local_f9,(fold *)local_98);
  _Var13._M_pi = _Stack_c0._M_pi;
  peVar12 = local_c8;
  iVar1 = this->modifiedN;
  this->modifiedN = iVar1 + 1;
  psVar10 = (this->modifieds).
            super__Vector_base<std::shared_ptr<modified>,_std::allocator<std::shared_ptr<modified>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_c8 = (element_type *)0x0;
  _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = psVar10[iVar1].super___shared_ptr<modified,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  psVar10 = psVar10 + iVar1;
  (psVar10->super___shared_ptr<modified,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar12;
  (psVar10->super___shared_ptr<modified,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       _Var13._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
  }
  modified::~modified((modified *)local_98);
  if (USE_DEPENDENCY_CHECKING == true) {
    if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      piVar17 = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        iVar1 = *piVar17;
        ArraySet::Insert(&this->dc_candidates,iVar1);
        pvVar4 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar21 = *(pointer *)
                   ((long)&pvVar4[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + 8);
        for (piVar16 = pvVar4[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; piVar16 != piVar21; piVar16 = piVar16 + 1)
        {
          ArraySet::Insert(&this->dc_candidates,*piVar16);
        }
        piVar17 = piVar17 + 1;
      } while (piVar17 !=
               local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      piVar17 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        iVar1 = *piVar17;
        ArraySet::Insert(&this->dc_candidates,iVar1);
        pvVar4 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar21 = *(pointer *)
                   ((long)&pvVar4[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + 8);
        for (piVar16 = pvVar4[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; piVar16 != piVar21; piVar16 = piVar16 + 1)
        {
          ArraySet::Insert(&this->dc_candidates,*piVar16);
        }
        piVar17 = piVar17 + 1;
      } while (piVar17 !=
               local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_b0);
  if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void branch_and_reduce_algorithm::compute_fold(std::vector<int> const &S, std::vector<int> const &NS) {
    assert(NS.size() == S.size() + 1);

    // remove all vertices but the 1. neighbour
    std::vector<int> removed(S.size() * 2);
    for (unsigned int i = 0; i < S.size(); i++)
        removed[i] = S[i];
    for (unsigned int i = 0; i < S.size(); i++)
        removed[S.size() + i] = NS[1 + i];

    // s = first neighbour
    int s = NS[0];
    used.clear();
    for (int v : S)
        used.add(v);
    std::vector<int> &tmp = modTmp;
    int p = 0;
    for (int v : NS)
    {
        assert(!used.get(v));
        for (int u : adj[v])
            if (x[u] < 0 && used.add(u))
            {
                tmp[p++] = u;
            }
    }
    // tmp contains N(N(S))\S

    // set edges of s
    std::vector<std::vector<int>> newAdj(p + 1);
    {
        std::vector<int> copyOfTmp(tmp.begin(), tmp.begin() + p);
        newAdj[0].swap(copyOfTmp);
    }
    std::sort(newAdj[0].begin(), newAdj[0].end());
    std::vector<int> vs(p + 1);
    vs[0] = s;
    used.clear();
    for (int v : S)
        used.add(v);
    for (int v : NS)
        used.add(v);

    // set edges of vertices in tmp
    for (unsigned int i = 0; i < newAdj[0].size(); i++)
    {
        int v = newAdj[0][i];
        p = 0;
        bool add = false;
        for (int u : adj[v])
            if (x[u] < 0 && !used.get(u))
            {
                if (!add && s < u)
                {
                    tmp[p++] = s;
                    add = true;
                }
                tmp[p++] = u;
            }
        if (!add)
            tmp[p++] = s;
        vs[1 + i] = v;

        {
            std::vector<int> copyOfTmp(tmp.begin(), tmp.begin() + p);
            newAdj[i + 1].swap(copyOfTmp);
        }
    }

    modifieds[modifiedN++] = make_shared<fold>(fold(S.size(), removed, vs, newAdj, this));

    // dependency checking
    if (USE_DEPENDENCY_CHECKING) {
        for (int v : vs) {
            dc_candidates.Insert(v);

            for (int vv : adj[v]) {
                dc_candidates.Insert(vv);
            }
        }

        for (int v : removed) {
            dc_candidates.Insert(v);

            for (int vv : adj[v]) {
                dc_candidates.Insert(vv);
            }
        }
    }
}